

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O3

void __thiscall
ymfm::fm_engine_base<ymfm::opn_registers_base<true>_>::assign_operators
          (fm_engine_base<ymfm::opn_registers_base<true>_> *this)

{
  uint uVar1;
  _Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
  _Var2;
  _Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<true>_>_*,_false> _Var3;
  uint32_t chnum;
  long lVar4;
  long lVar5;
  uint uVar6;
  operator_mapping map;
  operator_mapping local_20;
  
  opn_registers_base<true>::operator_map((opn_registers_base<true> *)this,&local_20);
  lVar4 = 0;
  do {
    uVar1 = local_20.chan[lVar4];
    lVar5 = 0;
    do {
      uVar6 = uVar1 >> ((byte)lVar5 & 0x1f) & 0xff;
      _Var2.super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>.
      _M_head_impl = this->m_channel[lVar4]._M_t.
                     super___uniq_ptr_impl<ymfm::fm_channel<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_channel<ymfm::opn_registers_base<true>_>_>_>
                     .
                     super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>
      ;
      if (uVar6 == 0xff) {
        *(undefined8 *)
         ((long)_Var2.
                super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>.
                _M_head_impl + lVar5 + 0x10) = 0;
      }
      else {
        _Var3._M_head_impl =
             this->m_operator[uVar6]._M_t.
             super___uniq_ptr_impl<ymfm::fm_operator<ymfm::opn_registers_base<true>_>,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<true>_>_*,_std::default_delete<ymfm::fm_operator<ymfm::opn_registers_base<true>_>_>_>
             .super__Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<true>_>_*,_false>.
             _M_head_impl;
        ((_Head_base<0UL,_ymfm::fm_operator<ymfm::opn_registers_base<true>_>_*,_false> *)
        ((long)_Var2.
               super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>.
               _M_head_impl + lVar5 + 0x10))->_M_head_impl = _Var3._M_head_impl;
        if (_Var3._M_head_impl != (fm_operator<ymfm::opn_registers_base<true>_> *)0x0) {
          (_Var3._M_head_impl)->m_choffs =
               *(uint32_t *)
                _Var2.
                super__Head_base<0UL,_ymfm::fm_channel<ymfm::opn_registers_base<true>_>_*,_false>.
                _M_head_impl;
        }
      }
      lVar5 = lVar5 + 8;
    } while (lVar5 != 0x20);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return;
}

Assistant:

void fm_engine_base<RegisterType>::assign_operators()
{
	typename RegisterType::operator_mapping map;
	m_regs.operator_map(map);

	for (uint32_t chnum = 0; chnum < CHANNELS; chnum++)
		for (uint32_t index = 0; index < 4; index++)
		{
			uint32_t opnum = bitfield(map.chan[chnum], 8 * index, 8);
			m_channel[chnum]->assign(index, (opnum == 0xff) ? nullptr : m_operator[opnum].get());
		}
}